

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactorRefactor.cpp
# Opt level: O1

HighsInt __thiscall HFactor::rebuild(HFactor *this,HighsTimerClock *factor_timer_clock_pointer)

{
  uint uVar1;
  iterator iVar2;
  pointer piVar3;
  pointer piVar4;
  int iVar5;
  ulong uVar6;
  HighsInt k;
  ulong uVar7;
  long lVar8;
  double *pdVar9;
  int *piVar10;
  long lVar11;
  int iVar12;
  uint uVar13;
  iterator iVar14;
  int unaff_R13D;
  double dVar15;
  byte bVar16;
  int iVar17;
  vector<int,_std::allocator<int>_> *this_00;
  bool bVar18;
  HighsInt iRow_1;
  HighsInt local_iRow;
  HighsInt local_iRow_2;
  HighsInt iRow;
  vector<bool,_std::allocator<bool>_> has_pivot;
  HVector column;
  int local_1f8;
  int local_1f4;
  ulong local_1f0;
  double local_1e8;
  uint local_1e0;
  int local_1dc;
  double local_1d8;
  vector<int,std::allocator<int>> *local_1d0;
  ulong local_1c8;
  vector<double,std::allocator<double>> *local_1c0;
  vector<int,std::allocator<int>> *local_1b8;
  vector<int,_std::allocator<int>_> *local_1b0;
  vector<double,std::allocator<double>> *local_1a8;
  vector<double,std::allocator<double>> *local_1a0;
  long local_198;
  vector<int,_std::allocator<int>_> *local_190;
  long local_188;
  vector<bool,_std::allocator<bool>_> local_180;
  double local_158;
  undefined8 uStack_150;
  double local_140;
  vector<double,_std::allocator<double>_> *local_138;
  vector<int,std::allocator<int>> *local_130;
  double local_128;
  vector<bool,_std::allocator<bool>_> local_120;
  double local_f8;
  undefined8 uStack_f0;
  undefined8 local_e0;
  pointer local_d8;
  pointer piStack_d0;
  pointer local_c8;
  pointer pdStack_c0;
  pointer local_b8;
  pointer pdStack_b0;
  pointer local_a0;
  pointer pcStack_98;
  pointer local_90;
  pointer piStack_88;
  pointer local_80;
  pointer piStack_78;
  pointer local_60;
  pointer piStack_58;
  pointer local_50;
  pointer pdStack_48;
  pointer local_40;
  pointer pdStack_38;
  
  luClear(this);
  this->nwork = 0;
  this->basis_matrix_num_el = 0;
  iVar12 = this->num_row;
  local_120.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_120.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  local_120.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_120.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  local_120.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  std::vector<bool,_std::allocator<bool>_>::_M_fill_assign(&local_120,(long)iVar12,false);
  this->build_synthetic_tick = (this->refactor_info_).build_synthetic_tick;
  if (this->num_row < 1) {
    bVar18 = true;
    local_1f8 = unaff_R13D;
  }
  else {
    local_1b8 = (vector<int,std::allocator<int>> *)&this->u_index;
    local_1c0 = (vector<double,std::allocator<double>> *)&this->u_value;
    this_00 = &this->l_start;
    local_1d0 = (vector<int,std::allocator<int>> *)&this->u_pivot_index;
    local_1a0 = (vector<double,std::allocator<double>> *)&this->u_pivot_value;
    local_1a8 = (vector<double,std::allocator<double>> *)&this->u_start;
    local_130 = (vector<int,std::allocator<int>> *)&this->l_index;
    local_138 = &this->l_value;
    dVar15 = 0.0;
    local_190 = this_00;
    do {
      iVar5 = (this->refactor_info_).pivot_row.super__Vector_base<int,_std::allocator<int>_>._M_impl
              .super__Vector_impl_data._M_start[(long)dVar15];
      local_180.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p =
           (_Bit_type *)
           CONCAT44(local_180.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,iVar5);
      iVar17 = (this->refactor_info_).pivot_var.super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_start[(long)dVar15];
      local_198 = CONCAT44(local_198._4_4_,iVar17);
      bVar16 = (this->refactor_info_).pivot_type.
               super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
               super__Vector_impl_data._M_start[(long)dVar15];
      if (bVar16 < 2) {
        this->basis_matrix_num_el = this->basis_matrix_num_el + 1;
        iVar5 = (int)((ulong)((long)(this->l_index).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->l_index).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 2);
        local_e0 = (double)CONCAT44(local_e0._4_4_,iVar5);
        iVar14._M_current =
             (this->l_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar14._M_current ==
            (this->l_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (this_00,iVar14,(int *)&local_e0);
        }
        else {
          *iVar14._M_current = iVar5;
          (this->l_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar14._M_current + 1;
        }
        iVar14._M_current =
             (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar14._M_current ==
            (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (local_1d0,iVar14,(int *)&local_180);
        }
        else {
          *iVar14._M_current =
               (int)local_180.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
          (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar14._M_current + 1;
        }
        local_e0 = 1.0;
        iVar2._M_current =
             (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)local_1a0,iVar2,(double *)&local_e0)
          ;
        }
        else {
          *iVar2._M_current = 1.0;
          (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        iVar5 = (int)((ulong)((long)(this->u_index).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->u_index).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 2);
        local_e0 = (double)CONCAT44(local_e0._4_4_,iVar5);
        iVar14._M_current =
             (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar14._M_current ==
            (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)local_1a8,iVar14,(int *)&local_e0);
        }
        else {
          *iVar14._M_current = iVar5;
          (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar14._M_current + 1;
        }
LAB_0037b39b:
        this->basic_index
        [(int)local_180.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p] = (HighsInt)local_198;
        uVar7 = (ulong)(int)local_180.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
        uVar6 = uVar7 + 0x3f;
        if (-1 < (long)uVar7) {
          uVar6 = uVar7;
        }
        local_120.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p
        [((long)uVar6 >> 6) + ((ulong)((uVar7 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
             local_120.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p
             [((long)uVar6 >> 6) + ((ulong)((uVar7 & 0x800000000000003f) < 0x8000000000000001) - 1)]
             | 1L << ((byte)local_180.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p & 0x3f);
        iVar5 = 0;
        bVar18 = true;
      }
      else if ((bVar16 & 0xfe) == 2) {
        local_1e0 = this->a_start[iVar17];
        uVar1 = this->a_start[(long)iVar17 + 1];
        lVar11 = (long)(int)local_1e0;
        local_1f0 = 0xffffffff;
        local_1c8 = CONCAT44(local_1c8._4_4_,uVar1);
        uVar6 = local_1f0;
        if ((int)local_1e0 < (int)uVar1) {
          piVar10 = this->a_index + lVar11;
          uVar13 = local_1e0;
          do {
            uVar6 = (ulong)uVar13;
            if (*piVar10 == iVar5) break;
            uVar13 = uVar13 + 1;
            piVar10 = piVar10 + 1;
            uVar6 = local_1f0;
          } while (uVar1 != uVar13);
        }
        local_1f0 = uVar6;
        local_188 = (long)(int)local_1f0;
        local_f8 = ABS(this->a_value[local_188]);
        local_140 = this->pivot_tolerance;
        uStack_f0 = 0;
        local_158 = dVar15;
        if (local_f8 < local_140) {
          unaff_R13D = this->nwork + 1;
        }
        else {
          local_1b0 = (vector<int,_std::allocator<int>_> *)CONCAT44(local_1b0._4_4_,iVar12);
          if (bVar16 == 2) {
            local_128 = 1.0 / this->a_value[local_188];
            local_1d8 = (double)CONCAT44(local_1d8._4_4_,(int)local_1f0 + 1);
            iVar12 = 0;
            do {
              uVar1 = local_1d8._0_4_;
              if (iVar12 == 0) {
                uVar1 = local_1e0;
              }
              iVar5 = (int)local_1c8;
              if (iVar12 == 0) {
                iVar5 = (int)local_1f0;
              }
              iVar17 = iVar5 - uVar1;
              if (iVar17 != 0 && (int)uVar1 <= iVar5) {
                lVar8 = (long)(int)uVar1;
                lVar11 = lVar8 * 8;
                do {
                  iVar5 = this->a_index[lVar8];
                  uVar7 = (ulong)iVar5;
                  local_1e8 = (double)CONCAT44(local_1e8._4_4_,iVar5);
                  uVar6 = uVar7 + 0x3f;
                  if (-1 < (long)uVar7) {
                    uVar6 = uVar7;
                  }
                  if ((local_120.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                       [((long)uVar6 >> 6) +
                        ((ulong)((uVar7 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
                       (uVar7 & 0x3f) & 1) == 0) {
                    iVar14._M_current =
                         (this->l_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                    if (iVar14._M_current ==
                        (this->l_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                (local_130,iVar14,(int *)&local_1e8);
                    }
                    else {
                      *iVar14._M_current = iVar5;
                      (this->l_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish = iVar14._M_current + 1;
                    }
                    local_e0 = this->a_value[lVar8] * local_128;
                    iVar2._M_current =
                         (this->l_value).super__Vector_base<double,_std::allocator<double>_>._M_impl
                         .super__Vector_impl_data._M_finish;
                    if (iVar2._M_current ==
                        (this->l_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                                (local_138,iVar2,(double *)&local_e0);
                    }
                    else {
                      *iVar2._M_current = local_e0;
                      (this->l_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
                    }
                  }
                  else {
                    iVar14._M_current =
                         (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                    if (iVar14._M_current ==
                        (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                (local_1b8,iVar14,(int *)&local_1e8);
                    }
                    else {
                      *iVar14._M_current = iVar5;
                      (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish = iVar14._M_current + 1;
                    }
                    pdVar9 = (double *)((long)this->a_value + lVar11);
                    iVar2._M_current =
                         (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl
                         .super__Vector_impl_data._M_finish;
                    if (iVar2._M_current ==
                        (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                                (local_1c0,iVar2,pdVar9);
                    }
                    else {
                      *iVar2._M_current = *pdVar9;
                      (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
                    }
                  }
                  lVar8 = lVar8 + 1;
                  lVar11 = lVar11 + 8;
                  iVar17 = iVar17 + -1;
                } while (iVar17 != 0);
              }
              this_00 = local_190;
              bVar18 = iVar12 == 0;
              iVar12 = iVar12 + 1;
            } while (bVar18);
            iVar12 = (int)((ulong)((long)(this->l_index).
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_finish -
                                  (long)(this->l_index).
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start) >> 2);
            local_e0 = (double)CONCAT44(local_e0._4_4_,iVar12);
            iVar14._M_current =
                 (this->l_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar14._M_current ==
                (this->l_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (local_190,iVar14,(int *)&local_e0);
              iVar12 = (int)local_1b0;
            }
            else {
              *iVar14._M_current = iVar12;
              (this->l_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar14._M_current + 1;
              iVar12 = (int)local_1b0;
            }
            dVar15 = local_158;
            iVar14._M_current =
                 (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar14._M_current ==
                (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (local_1d0,iVar14,(int *)&local_180);
            }
            else {
              *iVar14._M_current =
                   (int)local_180.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
              (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar14._M_current + 1;
            }
            iVar2._M_current =
                 (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar2._M_current ==
                (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                        (local_1a0,iVar2,this->a_value + local_188);
            }
            else {
              *iVar2._M_current = this->a_value[local_188];
              (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar2._M_current + 1;
            }
            iVar5 = (int)((ulong)((long)(this->u_index).
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_finish -
                                 (long)(this->u_index).super__Vector_base<int,_std::allocator<int>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 2);
            local_e0 = (double)CONCAT44(local_e0._4_4_,iVar5);
            iVar14._M_current =
                 (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar14._M_current ==
                (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        ((vector<int,_std::allocator<int>_> *)local_1a8,iVar14,(int *)&local_e0);
            }
            else {
LAB_0037b366:
              *iVar14._M_current = iVar5;
              (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar14._M_current + 1;
            }
          }
          else {
            iVar12 = (int)local_1f0 - local_1e0;
            if (iVar12 != 0 && (int)local_1e0 <= (int)local_1f0) {
              lVar8 = lVar11 * 4;
              lVar11 = lVar11 << 3;
              do {
                piVar10 = (int *)((long)this->a_index + lVar8);
                iVar14._M_current =
                     (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar14._M_current ==
                    (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            (local_1b8,iVar14,piVar10);
                }
                else {
                  *iVar14._M_current = *piVar10;
                  (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish = iVar14._M_current + 1;
                }
                pdVar9 = (double *)((long)this->a_value + lVar11);
                iVar2._M_current =
                     (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar2._M_current ==
                    (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                            (local_1c0,iVar2,pdVar9);
                }
                else {
                  *iVar2._M_current = *pdVar9;
                  (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish = iVar2._M_current + 1;
                }
                lVar8 = lVar8 + 4;
                lVar11 = lVar11 + 8;
                iVar12 = iVar12 + -1;
              } while (iVar12 != 0);
            }
            iVar5 = (uint)local_1f0 + 1;
            iVar12 = (int)local_1b0;
            if (iVar5 < (int)local_1c8) {
              lVar11 = (long)iVar5 * 4;
              lVar8 = (long)iVar5 << 3;
              iVar5 = ~(uint)local_1f0 + (int)local_1c8;
              do {
                piVar10 = (int *)((long)this->a_index + lVar11);
                iVar14._M_current =
                     (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar14._M_current ==
                    (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            (local_1b8,iVar14,piVar10);
                }
                else {
                  *iVar14._M_current = *piVar10;
                  (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish = iVar14._M_current + 1;
                }
                pdVar9 = (double *)((long)this->a_value + lVar8);
                iVar2._M_current =
                     (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar2._M_current ==
                    (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                            (local_1c0,iVar2,pdVar9);
                }
                else {
                  *iVar2._M_current = *pdVar9;
                  (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish = iVar2._M_current + 1;
                }
                lVar11 = lVar11 + 4;
                lVar8 = lVar8 + 8;
                iVar5 = iVar5 + -1;
              } while (iVar5 != 0);
            }
            this_00 = local_190;
            iVar5 = (int)((ulong)((long)(this->l_index).
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_finish -
                                 (long)(this->l_index).super__Vector_base<int,_std::allocator<int>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 2);
            local_e0 = (double)CONCAT44(local_e0._4_4_,iVar5);
            iVar14._M_current =
                 (this->l_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar14._M_current ==
                (this->l_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (local_190,iVar14,(int *)&local_e0);
            }
            else {
              *iVar14._M_current = iVar5;
              (this->l_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar14._M_current + 1;
            }
            dVar15 = local_158;
            iVar14._M_current =
                 (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar14._M_current ==
                (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (local_1d0,iVar14,(int *)&local_180);
            }
            else {
              *iVar14._M_current =
                   (int)local_180.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
              (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar14._M_current + 1;
            }
            iVar2._M_current =
                 (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar2._M_current ==
                (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                        (local_1a0,iVar2,this->a_value + local_188);
            }
            else {
              *iVar2._M_current = this->a_value[local_188];
              (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar2._M_current + 1;
            }
            iVar5 = (int)((ulong)((long)(this->u_index).
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_finish -
                                 (long)(this->u_index).super__Vector_base<int,_std::allocator<int>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 2);
            local_e0 = (double)CONCAT44(local_e0._4_4_,iVar5);
            iVar14._M_current =
                 (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar14._M_current !=
                (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) goto LAB_0037b366;
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      ((vector<int,_std::allocator<int>_> *)local_1a8,iVar14,(int *)&local_e0);
          }
        }
        if (local_140 <= local_f8) goto LAB_0037b39b;
        iVar5 = 1;
        bVar18 = false;
      }
      else {
        bVar18 = false;
        iVar5 = 2;
        iVar12 = SUB84(dVar15,0);
      }
      if (!bVar18) goto LAB_0037b41b;
      dVar15 = (double)((long)dVar15 + 1);
    } while ((long)dVar15 < (long)this->num_row);
    iVar5 = 2;
LAB_0037b41b:
    bVar18 = iVar5 == 2;
    local_1f8 = unaff_R13D;
  }
  if (bVar18) {
    if (iVar12 < this->num_row) {
      std::vector<int,_std::allocator<int>_>::resize(&this->l_start,(long)this->num_row + 1);
      iVar5 = this->num_row;
      if (iVar12 < iVar5) {
        piVar3 = (this->l_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar11 = (long)iVar12;
        iVar17 = piVar3[lVar11];
        do {
          piVar3[lVar11 + 1] = iVar17;
          lVar11 = lVar11 + 1;
          iVar5 = this->num_row;
        } while (lVar11 < iVar5);
      }
      std::vector<int,_std::allocator<int>_>::resize(&this->l_pivot_index,(long)iVar5);
      iVar5 = this->num_row;
      if (0 < iVar5) {
        piVar3 = (this->refactor_info_).pivot_row.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        piVar4 = (this->l_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar11 = 0;
        do {
          piVar4[lVar11] = piVar3[lVar11];
          lVar11 = lVar11 + 1;
          iVar5 = this->num_row;
        } while (lVar11 < iVar5);
      }
      std::vector<int,_std::allocator<int>_>::resize(&this->l_pivot_lookup,(long)iVar5);
      if (0 < this->num_row) {
        piVar3 = (this->l_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar4 = (this->l_pivot_lookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar11 = 0;
        do {
          piVar4[piVar3[lVar11]] = (int)lVar11;
          lVar11 = lVar11 + 1;
        } while (lVar11 < this->num_row);
      }
      std::vector<bool,_std::allocator<bool>_>::vector(&local_180,&local_120);
      local_b8 = (pointer)0x0;
      pdStack_b0 = (pointer)0x0;
      local_c8 = (pointer)0x0;
      pdStack_c0 = (pointer)0x0;
      local_d8 = (pointer)0x0;
      piStack_d0 = (pointer)0x0;
      local_a0 = (pointer)0x0;
      pcStack_98 = (pointer)0x0;
      local_90 = (pointer)0x0;
      piStack_88 = (pointer)0x0;
      local_80 = (pointer)0x0;
      piStack_78 = (pointer)0x0;
      local_60 = (pointer)0x0;
      piStack_58 = (pointer)0x0;
      local_50 = (pointer)0x0;
      pdStack_48 = (pointer)0x0;
      local_40 = (pointer)0x0;
      pdStack_38 = (pointer)0x0;
      HVectorBase<double>::setup((HVectorBase<double> *)&local_e0,this->num_row);
      bVar16 = iVar12 < this->num_row;
      if (iVar12 < this->num_row) {
        local_1b8 = (vector<int,std::allocator<int>> *)&this->u_index;
        local_1c0 = (vector<double,std::allocator<double>> *)&this->u_value;
        local_130 = (vector<int,std::allocator<int>> *)&this->l_index;
        local_138 = &this->l_value;
        local_1a0 = (vector<double,std::allocator<double>> *)&this->u_pivot_index;
        local_1a8 = (vector<double,std::allocator<double>> *)&this->u_pivot_value;
        local_1b0 = &this->u_start;
        lVar11 = (long)iVar12;
        local_1d8 = 0.0;
        do {
          local_1f4 = (this->refactor_info_).pivot_row.super__Vector_base<int,_std::allocator<int>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar11];
          iVar12 = (this->refactor_info_).pivot_var.super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar11];
          local_198 = lVar11;
          HVectorBase<double>::clear((HVectorBase<double> *)&local_e0);
          local_188 = CONCAT44(local_188._4_4_,iVar12);
          iVar5 = this->a_start[iVar12];
          lVar11 = (long)iVar5;
          iVar12 = this->a_start[(long)iVar12 + 1];
          if (iVar5 < iVar12) {
            do {
              iVar5 = this->a_index[lVar11];
              uVar7 = (ulong)iVar5;
              local_1e8 = (double)CONCAT44(local_1e8._4_4_,iVar5);
              uVar6 = uVar7 + 0x3f;
              if (-1 < (long)uVar7) {
                uVar6 = uVar7;
              }
              if ((local_180.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                   [((long)uVar6 >> 6) +
                    ((ulong)((uVar7 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
                   (uVar7 & 0x3f) & 1) == 0) {
                lVar8 = (long)local_e0._4_4_;
                local_e0 = (double)CONCAT44(local_e0._4_4_ + 1,(int)local_e0);
                local_d8[lVar8] = iVar5;
                pdStack_c0[iVar5] = this->a_value[lVar11];
              }
              else {
                iVar14._M_current =
                     (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar14._M_current ==
                    (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            (local_1b8,iVar14,(int *)&local_1e8);
                }
                else {
                  *iVar14._M_current = iVar5;
                  (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish = iVar14._M_current + 1;
                }
                iVar2._M_current =
                     (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar2._M_current ==
                    (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                            (local_1c0,iVar2,this->a_value + lVar11);
                }
                else {
                  *iVar2._M_current = this->a_value[lVar11];
                  (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish = iVar2._M_current + 1;
                }
              }
              lVar11 = lVar11 + 1;
            } while ((int)lVar11 != iVar12);
          }
          ftranL(this,(HVectorBase<double> *)&local_e0,local_1d8,(HighsTimerClock *)0x0);
          local_1d8 = local_1d8 * 0.95;
          local_140 = ((double)local_e0._4_4_ / (double)this->num_row) * 0.05;
          HVectorBase<double>::tight((HVectorBase<double> *)&local_e0);
          local_1c8 = (ulong)local_e0._4_4_;
          local_1f0 = 0xffffffff;
          uVar6 = local_1f0;
          if (0 < (long)local_1c8) {
            uVar7 = 0;
            do {
              uVar6 = uVar7;
              if (local_d8[uVar7] == local_1f4) break;
              uVar7 = uVar7 + 1;
              uVar6 = local_1f0;
            } while (local_1c8 != uVar7);
          }
          local_1f0 = uVar6;
          local_158 = ABS(pdStack_c0[local_1f4]);
          local_f8 = this->pivot_tolerance;
          uStack_150 = 0;
          if (local_158 < local_f8) {
            local_1f8 = this->num_row - (int)local_198;
            lVar11 = local_198;
          }
          else {
            local_1d0 = (vector<int,std::allocator<int>> *)CONCAT71(local_1d0._1_7_,bVar16);
            local_128 = 1.0 / pdStack_c0[local_1f4];
            local_1e0 = (int)local_1f0 + 1;
            iVar12 = 0;
            do {
              uVar1 = local_1e0;
              if (iVar12 == 0) {
                uVar1 = 0;
              }
              iVar5 = (int)local_1c8;
              if (iVar12 == 0) {
                iVar5 = (int)local_1f0;
              }
              iVar17 = iVar5 - uVar1;
              if (iVar17 != 0 && (int)uVar1 <= iVar5) {
                lVar11 = (long)(int)uVar1;
                do {
                  local_1dc = local_d8[lVar11];
                  uVar7 = (ulong)local_1dc;
                  uVar6 = uVar7 + 0x3f;
                  if (-1 < (long)uVar7) {
                    uVar6 = uVar7;
                  }
                  if ((local_120.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                       [((long)uVar6 >> 6) +
                        ((ulong)((uVar7 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
                       (uVar7 & 0x3f) & 1) == 0) {
                    iVar14._M_current =
                         (this->l_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                    if (iVar14._M_current ==
                        (this->l_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                (local_130,iVar14,&local_1dc);
                    }
                    else {
                      *iVar14._M_current = local_1dc;
                      (this->l_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish = iVar14._M_current + 1;
                    }
                    local_1e8 = pdStack_c0[local_1dc] * local_128;
                    iVar2._M_current =
                         (this->l_value).super__Vector_base<double,_std::allocator<double>_>._M_impl
                         .super__Vector_impl_data._M_finish;
                    if (iVar2._M_current ==
                        (this->l_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                                (local_138,iVar2,&local_1e8);
                    }
                    else {
                      *iVar2._M_current = local_1e8;
                      (this->l_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
                    }
                  }
                  else {
                    iVar14._M_current =
                         (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                    if (iVar14._M_current ==
                        (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                (local_1b8,iVar14,&local_1dc);
                    }
                    else {
                      *iVar14._M_current = local_1dc;
                      (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish = iVar14._M_current + 1;
                    }
                    iVar2._M_current =
                         (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl
                         .super__Vector_impl_data._M_finish;
                    if (iVar2._M_current ==
                        (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                                (local_1c0,iVar2,pdStack_c0 + local_1dc);
                    }
                    else {
                      *iVar2._M_current = pdStack_c0[local_1dc];
                      (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
                    }
                  }
                  lVar11 = lVar11 + 1;
                  iVar17 = iVar17 + -1;
                } while (iVar17 != 0);
              }
              lVar11 = local_198;
              bVar18 = iVar12 == 0;
              iVar12 = iVar12 + 1;
            } while (bVar18);
            (this->l_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[local_198 + 1] =
                 (int)((ulong)((long)(this->l_index).super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->l_index).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 2);
            iVar14._M_current =
                 (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar14._M_current ==
                (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)local_1a0,iVar14,&local_1f4);
              bVar16 = (byte)local_1d0;
            }
            else {
              *iVar14._M_current = local_1f4;
              (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar14._M_current + 1;
              bVar16 = (byte)local_1d0;
            }
            iVar2._M_current =
                 (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar2._M_current ==
                (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                        (local_1a8,iVar2,pdStack_c0 + local_1f4);
            }
            else {
              *iVar2._M_current = pdStack_c0[local_1f4];
              (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar2._M_current + 1;
            }
            iVar12 = (int)((ulong)((long)(this->u_index).
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_finish -
                                  (long)(this->u_index).
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start) >> 2);
            local_1e8 = (double)CONCAT44(local_1e8._4_4_,iVar12);
            iVar14._M_current =
                 (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar14._M_current ==
                (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (local_1b0,iVar14,(int *)&local_1e8);
            }
            else {
              *iVar14._M_current = iVar12;
              (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar14._M_current + 1;
            }
            this->basic_index[local_1f4] = (HighsInt)local_188;
            uVar7 = (ulong)local_1f4;
            uVar6 = uVar7 + 0x3f;
            if (-1 < (long)uVar7) {
              uVar6 = uVar7;
            }
            local_120.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p
            [((long)uVar6 >> 6) + ((ulong)((uVar7 & 0x800000000000003f) < 0x8000000000000001) - 1)]
                 = local_120.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                   [((long)uVar6 >> 6) +
                    ((ulong)((uVar7 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
                   1L << ((byte)local_1f4 & 0x3f);
          }
          if (local_158 < local_f8) break;
          local_1d8 = local_1d8 + local_140;
          lVar11 = lVar11 + 1;
          bVar16 = lVar11 < this->num_row;
        } while (lVar11 < this->num_row);
      }
      if (pdStack_48 != (pointer)0x0) {
        operator_delete(pdStack_48);
      }
      if (local_60 != (pointer)0x0) {
        operator_delete(local_60);
      }
      if (piStack_88 != (pointer)0x0) {
        operator_delete(piStack_88);
      }
      if (local_a0 != (pointer)0x0) {
        operator_delete(local_a0);
      }
      if (pdStack_c0 != (pointer)0x0) {
        operator_delete(pdStack_c0);
      }
      if (local_d8 != (pointer)0x0) {
        operator_delete(local_d8);
      }
      if (local_180.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_180.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        local_180.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_180.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_offset = 0;
        local_180.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_180.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_offset = 0;
        local_180.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage = (_Bit_pointer)0x0;
      }
      if ((bVar16 & 1) != 0) goto LAB_0037bbe8;
    }
    local_1f8 = 0;
    buildFinish(this);
  }
LAB_0037bbe8:
  if (local_120.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_120.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return local_1f8;
}

Assistant:

HighsInt HFactor::rebuild(HighsTimerClock* factor_timer_clock_pointer) {
  const bool report_lu = false;
  // Check that the refactorization information should be used
  assert(refactor_info_.use);
  /**
   * 0. Clear L and U factor
   */
  luClear();

  nwork = 0;
  basis_matrix_num_el = 0;
  HighsInt stage = num_row;
  HighsInt rank_deficiency = 0;
  vector<bool> has_pivot;
  has_pivot.assign(num_row, false);
  const bool report_unit = false;
  const bool report_singletons = false;
  const bool report_markowitz = false;
  const bool report_anything =
      report_unit || report_singletons || report_markowitz;
  if (report_anything) printf("\nRefactor\n");
  // Take build_synthetic_tick from the refactor info so that this
  // refactorization doesn't look unrealistically cheap.
  this->build_synthetic_tick = this->refactor_info_.build_synthetic_tick;
  // Check that the refactorization info has been set up
  assert((int)this->refactor_info_.pivot_row.size() >= num_row);
  assert((int)this->refactor_info_.pivot_var.size() >= num_row);
  assert((int)this->refactor_info_.pivot_type.size() >= num_row);
  for (HighsInt iK = 0; iK < num_row; iK++) {
    HighsInt iRow = this->refactor_info_.pivot_row[iK];
    HighsInt iVar = this->refactor_info_.pivot_var[iK];
    int8_t pivot_type = this->refactor_info_.pivot_type[iK];
    assert(!has_pivot[iRow]);

    if (pivot_type == kPivotLogical || pivot_type == kPivotUnit) {
      if (pivot_type == kPivotLogical) {
        //
        // 1.1 Logical column
        if (report_unit) printf("Stage %d: Logical\n", (int)iK);
        assert(iVar >= num_col);
        basis_matrix_num_el++;
      } else if (pivot_type == kPivotUnit) {
        //
        // 1.2 (Structural) unit column
        if (report_unit) printf("Stage %d: Unit\n", (int)iK);
        assert(iVar < num_col);
        HighsInt start = a_start[iVar];
        HighsInt count = a_start[iVar + 1] - start;
        assert(a_index[start] == iRow);
        assert(count == 1 && a_value[start] == 1);
        basis_matrix_num_el++;
      }
      // 1.3 Record unit column
      l_start.push_back(l_index.size());
      u_pivot_index.push_back(iRow);
      u_pivot_value.push_back(1);
      u_start.push_back(u_index.size());
    } else if (pivot_type == kPivotRowSingleton ||
               pivot_type == kPivotColSingleton) {
      //
      // Row or column singleton
      assert(iVar < num_col);
      const HighsInt start = a_start[iVar];
      const HighsInt end = a_start[iVar + 1];
      // Find where the pivot is
      HighsInt pivot_k = -1;
      for (HighsInt k = start; k < end; k++) {
        if (a_index[k] == iRow) {
          pivot_k = k;
          break;
        }
      }
      assert(pivot_k >= 0);
      // Check that the pivot isn't too small. Shouldn't happen since
      // this is refactorization
      double abs_pivot = std::fabs(a_value[pivot_k]);
      assert(abs_pivot >= pivot_tolerance);
      if (abs_pivot < pivot_tolerance) {
        rank_deficiency = nwork + 1;
        return rank_deficiency;
      }
      if (pivot_type == kPivotRowSingleton) {
        //
        // 2.2 Deal with row singleton
        const double pivot_multiplier = 1 / a_value[pivot_k];
        if (report_singletons)
          printf("Stage %d: Row singleton (%4d, %g)\n", (int)iK, (int)pivot_k,
                 pivot_multiplier);
        for (HighsInt section = 0; section < 2; section++) {
          HighsInt p0 = section == 0 ? start : pivot_k + 1;
          HighsInt p1 = section == 0 ? pivot_k : end;
          for (HighsInt k = p0; k < p1; k++) {
            HighsInt local_iRow = a_index[k];
            if (!has_pivot[local_iRow]) {
              if (report_singletons)
                printf("Row singleton: L En (%4d, %11.4g)\n", (int)local_iRow,
                       a_value[k] * pivot_multiplier);
              l_index.push_back(local_iRow);
              l_value.push_back(a_value[k] * pivot_multiplier);
            } else {
              if (report_singletons)
                printf("Row singleton: U En (%4d, %11.4g)\n", (int)local_iRow,
                       a_value[k]);
              u_index.push_back(local_iRow);
              u_value.push_back(a_value[k]);
            }
          }
        }
        l_start.push_back(l_index.size());
        if (report_singletons)
          printf("Row singleton: U Pv (%4d, %11.4g)\n", (int)iRow,
                 a_value[pivot_k]);
        u_pivot_index.push_back(iRow);
        u_pivot_value.push_back(a_value[pivot_k]);
        u_start.push_back(u_index.size());
      } else {
        //
        // 2.3 Deal with column singleton
        if (report_singletons) printf("Stage %d: Col singleton\n", (int)iK);
        for (HighsInt k = start; k < pivot_k; k++) {
          if (report_singletons)
            printf("Col singleton: U En (%4d, %11.4g)\n", (int)a_index[k],
                   a_value[k]);
          u_index.push_back(a_index[k]);
          u_value.push_back(a_value[k]);
        }
        for (HighsInt k = pivot_k + 1; k < end; k++) {
          if (report_singletons)
            printf("Col singleton: U En (%4d, %11.4g)\n", (int)a_index[k],
                   a_value[k]);
          u_index.push_back(a_index[k]);
          u_value.push_back(a_value[k]);
        }
        l_start.push_back(l_index.size());
        if (report_singletons)
          printf("Col singleton: U Pv (%4d, %11.4g)\n", (int)iRow,
                 a_value[pivot_k]);
        u_pivot_index.push_back(iRow);
        u_pivot_value.push_back(a_value[pivot_k]);
        u_start.push_back(u_index.size());
      }
    } else {
      assert(pivot_type == kPivotMarkowitz);
      stage = iK;
      break;
    }
    basic_index[iRow] = iVar;
    has_pivot[iRow] = true;
  }
  if (report_lu) {
    printf("\nAfter units and singletons\n");
    reportLu(kReportLuBoth, false);
  }
  if (stage < num_row) {
    // Handle the remaining Markowitz pivots
    //
    // First of all complete the L factor with identity columns so
    // that FtranL counts the RHS entries in rows that don't yet have
    // picots by running to completion. In the hyper-sparse code,
    // these will HOPEFULLY be skipped
    //
    // There are already l_start entries for the first stage rows, but
    // l_pivot_index is not assigned, as u_pivot_index gets copied into it
    l_start.resize(num_row + 1);
    for (HighsInt iK = stage; iK < num_row; iK++) l_start[iK + 1] = l_start[iK];
    l_pivot_index.resize(num_row);
    for (HighsInt iK = 0; iK < num_row; iK++)
      l_pivot_index[iK] = this->refactor_info_.pivot_row[iK];
    // To do hyper-sparse FtranL operations, have to set up l_pivot_lookup.
    l_pivot_lookup.resize(num_row);
    for (HighsInt iRow = 0; iRow < num_row; iRow++) {
      if (iRow < stage) {
        if (l_pivot_lookup[l_pivot_index[iRow]] != iRow) {
          // printf("Strange: Thought that l_pivot_lookup[l_pivot_index[iRow]]
          // == iRow\n");
        }
      }
      l_pivot_lookup[l_pivot_index[iRow]] = iRow;
    }
    // Need to know whether to consider matrix entries for FtranL
    // operation. Initially these correspond to all the rows without
    // pivots
    vector<bool> not_in_bump = has_pivot;
    // Monitor density of FtranL result to possibly switch from exploiting
    // hyper-sparsity
    double expected_density = 0.0;
    // Initialise a HVector in which the L and U entries of the
    // pivotal column will be formed
    HVector column;
    column.setup(num_row);
    for (HighsInt iK = stage; iK < num_row; iK++) {
      HighsInt iRow = this->refactor_info_.pivot_row[iK];
      HighsInt iVar = this->refactor_info_.pivot_var[iK];
      int8_t pivot_type = this->refactor_info_.pivot_type[iK];
      assert(!has_pivot[iRow]);
      assert(pivot_type == kPivotMarkowitz);
      // Set up the column for the FtranL. It contains the matrix
      // entries in rows without pivots, and the remaining entries
      // start forming the U column
      column.clear();
      HighsInt start = a_start[iVar];
      HighsInt end = a_start[iVar + 1];
      for (HighsInt iEl = start; iEl < end; iEl++) {
        HighsInt local_iRow = a_index[iEl];
        if (not_in_bump[local_iRow]) {
          u_index.push_back(local_iRow);
          u_value.push_back(a_value[iEl]);
        } else {
          column.index[column.count++] = local_iRow;
          column.array[local_iRow] = a_value[iEl];
        }
      }
      // Perform FtranL, but don't time it!
      ftranL(column, expected_density);
      // Update the running average density
      double local_density = (1.0 * column.count) / num_row;
      expected_density = kRunningAverageMultiplier * local_density +
                         (1 - kRunningAverageMultiplier) * expected_density;
      // Strip out small values
      column.tight();
      // Now form the column of L
      //
      // Find the pivot
      HighsInt pivot_k = -1;
      start = 0;
      end = column.count;
      for (HighsInt k = start; k < end; k++) {
        if (column.index[k] == iRow) {
          pivot_k = k;
          break;
        }
      }
      assert(pivot_k >= 0);
      // Check that the pivot isn't too small. Shouldn't happen since
      // this is refactorization
      double abs_pivot = std::fabs(column.array[iRow]);
      assert(abs_pivot >= pivot_tolerance);
      if (abs_pivot < pivot_tolerance) {
        rank_deficiency = num_row - iK;
        return rank_deficiency;
      }
      const double pivot_multiplier = 1 / column.array[iRow];
      for (HighsInt section = 0; section < 2; section++) {
        HighsInt p0 = section == 0 ? start : pivot_k + 1;
        HighsInt p1 = section == 0 ? pivot_k : end;
        for (HighsInt k = p0; k < p1; k++) {
          HighsInt local_iRow = column.index[k];
          if (!has_pivot[local_iRow]) {
            l_index.push_back(local_iRow);
            l_value.push_back(column.array[local_iRow] * pivot_multiplier);
          } else {
            u_index.push_back(local_iRow);
            u_value.push_back(column.array[local_iRow]);
          }
        }
      }
      l_start[iK + 1] = l_index.size();
      u_pivot_index.push_back(iRow);
      u_pivot_value.push_back(column.array[iRow]);
      u_start.push_back(u_index.size());
      basic_index[iRow] = iVar;
      has_pivot[iRow] = true;
      if (report_lu) {
        printf("\nAfter Markowitz %d\n", (int)(iK - stage));
        reportLu(kReportLuBoth, false);
      }
    }
  }
  if (report_lu) {
    printf("\nRefactored INVERT\n");
    reportLu(kReportLuBoth, false);
  }
  buildFinish();
  return 0;
}